

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_init_gnss_gps(fsnav_gnss_gps *gps,size_t max_sat_count,size_t max_eph_count)

{
  undefined8 *puVar1;
  char cVar2;
  fsnav_gnss_sat *pfVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  
  pfVar3 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  gps->max_sat_count = 0;
  gps->max_eph_count = 0;
  gps->sat = pfVar3;
  if (pfVar3 == (fsnav_gnss_sat *)0x0) {
LAB_00106429:
    cVar2 = '\0';
  }
  else {
    gps->max_sat_count = max_sat_count;
    if (max_sat_count != 0) {
      lVar4 = 0x80;
      uVar6 = 0;
      do {
        pfVar3 = gps->sat;
        *(undefined8 *)((long)pfVar3 + lVar4 + -0x80) = 0;
        *(undefined1 *)((long)pfVar3 + lVar4 + -0x78) = 0;
        *(undefined8 *)((long)pfVar3 + lVar4 + -0x70) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar4 + -0x68) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar4 + -0x48) = 0;
        *(undefined1 *)((long)pfVar3 + lVar4 + -0x58) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar4 + -0x38) = 0;
        puVar1 = (undefined8 *)((long)pfVar3->x + lVar4 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        uVar6 = uVar6 + 1;
        uVar7 = gps->max_sat_count;
        lVar4 = lVar4 + 0x90;
      } while (uVar6 < uVar7);
      if (uVar7 != 0) {
        pfVar3 = gps->sat;
        do {
          pdVar5 = (double *)calloc(max_eph_count,8);
          pfVar3->eph = pdVar5;
          if (pdVar5 == (double *)0x0) goto LAB_00106429;
          pfVar3 = pfVar3 + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    gps->max_eph_count = max_eph_count;
    gps->iono_valid = '\0';
    gps->clock_corr_valid = '\0';
    gps->obs_types = (char (*) [4])0x0;
    gps->obs_count = 0;
    cVar2 = '\x01';
  }
  return cVar2;
}

Assistant:

char fsnav_init_gnss_gps(fsnav_gnss_gps* gps, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	gps->sat = NULL;
	gps->max_sat_count = 0;
	gps->max_eph_count = 0;

	// try to allocate memory for satellite data
	gps->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (gps->sat == NULL)
		return 0;
	gps->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < gps->max_sat_count; i++) 
		fsnav_init_gnss_sat(gps->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < gps->max_sat_count; i++) {
		gps->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (gps->sat[i].eph == NULL)
			return 0;
	}
	gps->max_eph_count = max_eph_count;

	// observation types
	gps->obs_types = NULL;
	gps->obs_count = 0;

	// validity flags
	gps->iono_valid = 0;
	gps->clock_corr_valid = 0;

	return 1;
}